

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MFP68901.cpp
# Opt level: O1

void __thiscall Motorola::MFP68901::MFP68901::run_timer_for<3>(MFP68901 *this,int cycles)

{
  int amount;
  int iVar1;
  
  if (1 < (int)this->timers_[3].mode) {
    iVar1 = cycles + this->timers_[3].prescale_count;
    amount = iVar1 / this->timers_[3].prescale;
    if (0 < amount) {
      decrement_timer<3>(this,amount);
      iVar1 = iVar1 % this->timers_[3].prescale;
    }
    this->timers_[3].prescale_count = iVar1;
  }
  return;
}

Assistant:

void MFP68901::run_timer_for(int cycles) {
	if(timers_[timer].mode >= TimerMode::Delay) {
		// This code applies the timer prescaling only. prescale_count is used to count
		// upwards rather than downwards for simplicity, but on the real hardware it's
		// pretty safe to assume it actually counted downwards. So the clamp to 0 is
		// because gymnastics may need to occur when the prescale value is altered, e.g.
		// if a prescale of 256 is set and the prescale_count is currently 2 then the
		// counter should roll over in 254 cycles. If the user at that point changes the
		// prescale_count to 1 then the counter will need to be altered to -253 and
		// allowed to keep counting up until it crosses both 0 and 1.
		const int dividend = timers_[timer].prescale_count + cycles;
		const int decrements = std::max(dividend / timers_[timer].prescale, 0);
		if(decrements) {
			decrement_timer<timer>(decrements);
			timers_[timer].prescale_count = dividend % timers_[timer].prescale;
		} else {
			timers_[timer].prescale_count += cycles;
		}
	}
}